

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
TimerTest_simultaneousTimers_Test::TimerTest_simultaneousTimers_Test
          (TimerTest_simultaneousTimers_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a08f8;
  return;
}

Assistant:

TEST(TimerTest, simultaneousTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;
	bool test_finished = false;

	// Spin up timer
	timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running, &test_finished]([[maybe_unused]] timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		if (test_finished) {
			notifier.notify_all();
			return;
		}

		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_all();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period + 100ms);
	EXPECT_GE(timers_running, 2);

	// Notify timers to close
	{
		std::unique_lock<std::mutex> lock(notifier_mutex);
		test_finished = true;
	}
	notifier.notify_all();

	// Wait for timers to complete
	timer_obj.cancel();
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}